

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.cpp
# Opt level: O1

bool SanityTest(pfHash hash,int hashbits)

{
  void *__dest;
  byte bVar1;
  bool bVar2;
  int iVar3;
  int len;
  byte bVar4;
  int iVar5;
  int iVar6;
  void *blob;
  void *blob_00;
  void *__s;
  void *__s_00;
  bool bVar7;
  ulong __n;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  ulong __n_00;
  bool bVar12;
  bool bVar13;
  uint8_t *key1;
  Rand local_48;
  
  printf("Running sanity check 1     ");
  local_48.x = 0x19e37934;
  local_48.y = 0x7bc33027;
  local_48.z = 0xa48a5061;
  local_48.w = 0x1bcbea7b;
  iVar6 = hashbits + 7;
  if (-1 < hashbits) {
    iVar6 = hashbits;
  }
  uVar10 = iVar6 >> 3;
  blob = operator_new__(0x130);
  blob_00 = operator_new__(0x130);
  __n_00 = (ulong)(int)uVar10;
  __s = operator_new__(__n_00);
  __s_00 = operator_new__(__n_00);
  memset(__s,1,__n_00);
  memset(__s_00,2,__n_00);
  iVar6 = 0;
  bVar7 = true;
LAB_001643fb:
  putchar(0x2e);
  __n = 4;
  iVar3 = 0x20;
  bVar13 = false;
LAB_00164421:
  uVar8 = 0x10;
  bVar12 = false;
LAB_00164440:
  __dest = (void *)((long)blob_00 + uVar8 + 0x10);
  Rand::rand_p(&local_48,blob,0x130);
  Rand::rand_p(&local_48,blob_00,0x130);
  memcpy(__dest,(void *)((long)blob + 0x10),__n);
  len = (int)__n;
  (*hash)((void *)((long)blob + 0x10),len,0,__s);
  bVar2 = true;
  uVar11 = 0;
  do {
    flipbit(__dest,len,(uint32_t)uVar11);
    (*hash)(__dest,len,0,__s_00);
    iVar5 = bcmp(__s,__s_00,__n_00);
    if (iVar5 == 0) {
      if (hashbits < 8) goto LAB_001645f0;
      uVar11 = 0;
      goto LAB_00164558;
    }
    flipbit(__dest,len,(uint32_t)uVar11);
    (*hash)(__dest,len,0,__s_00);
    iVar5 = bcmp(__s,__s_00,__n_00);
    if (iVar5 != 0) {
      if (hashbits < 8) goto LAB_001645f0;
      uVar11 = 0;
      goto LAB_00164588;
    }
    uVar11 = uVar11 + 1;
    bVar2 = uVar11 < __n * 8;
  } while (iVar3 != (int)uVar11);
  goto LAB_001645f4;
  while (uVar11 = uVar11 + 1, uVar10 != uVar11) {
LAB_00164558:
    bVar4 = *(byte *)((long)__s + uVar11);
    bVar1 = *(byte *)((long)__s_00 + uVar11);
    if (bVar4 == bVar1) {
      pcVar9 = " %d: 0x%02X == 0x%02X ";
      goto LAB_001645db;
    }
  }
LAB_001645f0:
  bVar7 = false;
LAB_001645f4:
  if (bVar2) goto LAB_00164614;
  bVar12 = 0x1e < uVar8;
  uVar8 = uVar8 + 1;
  if (uVar8 == 0x20) goto LAB_00164614;
  goto LAB_00164440;
LAB_00164588:
  bVar4 = *(byte *)((long)__s + uVar11);
  bVar1 = *(byte *)((long)__s_00 + uVar11);
  if (bVar4 == bVar1) goto code_r0x00164593;
  pcVar9 = " %d: 0x%02X != 0x%02X ";
LAB_001645db:
  printf(pcVar9,uVar11,(ulong)bVar4,(ulong)bVar1);
  goto LAB_001645f0;
code_r0x00164593:
  uVar11 = uVar11 + 1;
  if (uVar10 == uVar11) goto LAB_001645f0;
  goto LAB_00164588;
LAB_00164614:
  if (!bVar12) goto LAB_00164646;
  bVar13 = 0xff < __n;
  __n = __n + 1;
  iVar3 = iVar3 + 8;
  if (__n == 0x101) goto LAB_00164646;
  goto LAB_00164421;
LAB_00164646:
  if ((!bVar13) || (iVar6 = iVar6 + 1, iVar6 == 10)) {
    pcVar9 = " PASS";
    if (!bVar7) {
      pcVar9 = " FAIL  !!!!!";
    }
    puts(pcVar9);
    operator_delete__(blob);
    operator_delete__(blob_00);
    operator_delete__(__s);
    operator_delete__(__s_00);
    return bVar7;
  }
  goto LAB_001643fb;
}

Assistant:

bool SanityTest ( pfHash hash, const int hashbits )
{
  printf("Running sanity check 1     ");

  Rand r(883741);

  bool result = true;

  const int hashbytes = hashbits/8;
  const int reps = 10;
  const int keymax = 256;
  const int pad = 16;
  const int buflen = keymax + pad*3;

  uint8_t * buffer1 = new uint8_t[buflen];
  uint8_t * buffer2 = new uint8_t[buflen];

  uint8_t * hash1 = new uint8_t[hashbytes];
  uint8_t * hash2 = new uint8_t[hashbytes];

  //----------
  memset(hash1, 1, hashbytes);
  memset(hash2, 2, hashbytes);
  
  for(int irep = 0; irep < reps; irep++)
  {
    if(irep % (reps/10) == 0) printf(".");

    for(int len = 4; len <= keymax; len++)
    {
      for(int offset = pad; offset < pad*2; offset++)
      {
        uint8_t * key1 = &buffer1[pad];
        uint8_t * key2 = &buffer2[pad+offset];

        r.rand_p(buffer1,buflen);
        r.rand_p(buffer2,buflen);

        memcpy(key2,key1,len);

        hash(key1,len,0,hash1);

        for(int bit = 0; bit < (len * 8); bit++)
        {
          // Flip a bit, hash the key -> we should get a different result.

          flipbit(key2,len,bit);
          hash(key2,len,0,hash2);

          if(memcmp(hash1,hash2,hashbytes) == 0)
            {
              for(int i=0; i < hashbytes; i++){
                if (hash1[i] == hash2[i]) {
                  printf(" %d: 0x%02X == 0x%02X ", i, hash1[i], hash2[i]);
                  break;
                }
              }
              result = false;
              goto end_sanity;
            }

          // Flip it back, hash again -> we should get the original result.

          flipbit(key2,len,bit);
          hash(key2,len,0,hash2);

          if(memcmp(hash1,hash2,hashbytes) != 0)
            {
              for(int i=0; i < hashbytes; i++){
                if (hash1[i] != hash2[i]) {
                  printf(" %d: 0x%02X != 0x%02X ", i, hash1[i], hash2[i]);
                  break;
                }
              }
              result = false;
              goto end_sanity;
            }
        }
      }
    }
  }

 end_sanity:
  if(result == false)
  {
    printf(" FAIL  !!!!!\n");
  }
  else
  {
    printf(" PASS\n");
  }

  delete [] buffer1;
  delete [] buffer2;

  delete [] hash1;
  delete [] hash2;

  return result;
}